

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineDeviceComputer.cxx
# Opt level: O3

string * __thiscall
cmLinkLineDeviceComputer::ComputeLinkLibraries
          (string *__return_storage_ptr__,cmLinkLineDeviceComputer *this,
          cmComputeLinkInformation *cli,string *stdLibString)

{
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  pointer pIVar4;
  cmGeneratorTarget *this_00;
  ulong uVar5;
  cmLinkLineComputer *this_01;
  string *psVar6;
  bool bVar7;
  TargetType TVar8;
  int iVar9;
  ItemVector *pIVar10;
  ostream *poVar11;
  pointer pIVar12;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar13;
  string out;
  string config;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  ostringstream fout;
  string local_270;
  string local_250;
  cmLinkLineComputer *local_230;
  string *local_228;
  string *local_220;
  long *local_218 [2];
  long local_208 [2];
  string local_1f8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  undefined1 local_1a8 [376];
  
  local_230 = &this->super_cmLinkLineComputer;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1d8._M_impl.super__Rb_tree_header._M_header;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1d8._M_impl.super__Rb_tree_header._M_header._M_left;
  pIVar10 = cmComputeLinkInformation::GetItems(cli);
  local_218[0] = local_208;
  pcVar3 = (cli->Config)._M_dataplus._M_p;
  local_228 = stdLibString;
  local_220 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_218,pcVar3,pcVar3 + (cli->Config)._M_string_length);
  pIVar12 = (pIVar10->
            super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pIVar4 = (pIVar10->
           super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pIVar12 != pIVar4) {
    paVar2 = &local_270.field_2;
    bVar7 = false;
    do {
      if (bVar7) {
LAB_0033783f:
        bVar7 = false;
      }
      else {
        if (pIVar12->Target != (cmGeneratorTarget *)0x0) {
          TVar8 = cmGeneratorTarget::GetType(pIVar12->Target);
          if (TVar8 == STATIC_LIBRARY) {
            this_00 = pIVar12->Target;
            local_270._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_270,"CUDA_RESOLVE_DEVICE_SYMBOLS","");
            bVar7 = cmGeneratorTarget::GetPropertyAsBool(this_00,&local_270);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_270._M_dataplus._M_p != paVar2) {
              operator_delete(local_270._M_dataplus._M_p,
                              CONCAT71(local_270.field_2._M_allocated_capacity._1_7_,
                                       local_270.field_2._M_local_buf[0]) + 1);
            }
            if (bVar7) goto LAB_0033783f;
          }
          else {
            bVar7 = false;
            if ((TVar8 == MODULE_LIBRARY) || (TVar8 == INTERFACE_LIBRARY)) goto LAB_00337a3e;
          }
        }
        local_270._M_string_length = 0;
        local_270.field_2._M_local_buf[0] = '\0';
        if (pIVar12->IsPath == true) {
          uVar5 = (pIVar12->Value)._M_string_length;
          local_270._M_dataplus._M_p = (pointer)paVar2;
          if ((1 < uVar5) &&
             ((((pcVar3 = (pIVar12->Value)._M_dataplus._M_p, pcVar1 = pcVar3 + uVar5,
                pcVar3[uVar5 - 2] == '.' && (pcVar1[-1] == 'a')) && (*pcVar1 == '\0')) ||
              ((3 < uVar5 && (iVar9 = strcmp(pcVar1 + -4,".lib"), iVar9 == 0)))))) {
            this_01 = local_230;
            (*local_230->_vptr_cmLinkLineComputer[2])(&local_1f8,local_230,pIVar12);
            cmLinkLineComputer::ConvertToOutputFormat(&local_250,this_01,&local_1f8);
            std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_250._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != &local_250.field_2) {
              operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
              operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1
                             );
            }
          }
LAB_003379e4:
          pVar13 = std::
                   _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                   ::_M_insert_unique<std::__cxx11::string_const&>
                             ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                               *)&local_1d8,&local_270);
          if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,local_270._M_dataplus._M_p,
                                 local_270._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
          }
          bVar7 = false;
        }
        else {
          local_270._M_dataplus._M_p = (pointer)paVar2;
          iVar9 = std::__cxx11::string::compare((char *)pIVar12);
          if (iVar9 != 0) {
            pcVar1 = (pIVar12->Value)._M_dataplus._M_p;
            if (((*pcVar1 != '-') || ((byte)(pcVar1[1] | 0x20U) == 0x6c)) ||
               (iVar9 = strncmp(pcVar1,"--library",9), iVar9 == 0)) {
              std::__cxx11::string::_M_append((char *)&local_270,(ulong)pcVar1);
            }
            goto LAB_003379e4;
          }
          bVar7 = true;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != paVar2) {
          operator_delete(local_270._M_dataplus._M_p,
                          CONCAT71(local_270.field_2._M_allocated_capacity._1_7_,
                                   local_270.field_2._M_local_buf[0]) + 1);
        }
      }
LAB_00337a3e:
      pIVar12 = pIVar12 + 1;
    } while (pIVar12 != pIVar4);
  }
  psVar6 = local_220;
  if (local_228->_M_string_length != 0) {
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(local_228->_M_dataplus)._M_p,
                         local_228->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
  }
  std::__cxx11::stringbuf::str();
  if (local_218[0] != local_208) {
    operator_delete(local_218[0],local_208[0] + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_1d8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return psVar6;
}

Assistant:

std::string cmLinkLineDeviceComputer::ComputeLinkLibraries(
  cmComputeLinkInformation& cli, std::string const& stdLibString)
{
  // Write the library flags to the build rule.
  std::ostringstream fout;

  // Generate the unique set of link items when device linking.
  // The nvcc device linker is designed so that each static library
  // with device symbols only needs to be listed once as it doesn't
  // care about link order.
  std::set<std::string> emitted;
  typedef cmComputeLinkInformation::ItemVector ItemVector;
  ItemVector const& items = cli.GetItems();
  std::string config = cli.GetConfig();
  bool skipItemAfterFramework = false;
  for (auto const& item : items) {
    if (skipItemAfterFramework) {
      skipItemAfterFramework = false;
      continue;
    }

    if (item.Target) {
      bool skip = false;
      switch (item.Target->GetType()) {
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::INTERFACE_LIBRARY:
          skip = true;
          break;
        case cmStateEnums::STATIC_LIBRARY:
          skip = item.Target->GetPropertyAsBool("CUDA_RESOLVE_DEVICE_SYMBOLS");
          break;
        default:
          break;
      }
      if (skip) {
        continue;
      }
    }

    std::string out;
    if (item.IsPath) {
      // nvcc understands absolute paths to libraries ending in '.a' or '.lib'.
      // These should be passed to nvlink.  Other extensions need to be left
      // out because nvlink may not understand or need them.  Even though it
      // can tolerate '.so' or '.dylib' it cannot tolerate '.so.1'.
      if (cmHasLiteralSuffix(item.Value, ".a") ||
          cmHasLiteralSuffix(item.Value, ".lib")) {
        out += this->ConvertToOutputFormat(
          this->ConvertToLinkReference(item.Value));
      }
    } else if (item.Value == "-framework") {
      // This is the first part of '-framework Name' where the framework
      // name is specified as a following item.  Ignore both.
      skipItemAfterFramework = true;
      continue;
    } else if (cmLinkItemValidForDevice(item.Value)) {
      out += item.Value;
    }

    if (emitted.insert(out).second) {
      fout << out << " ";
    }
  }

  if (!stdLibString.empty()) {
    fout << stdLibString << " ";
  }

  return fout.str();
}